

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lockedpool.cpp
# Opt level: O0

void __thiscall LockedPool::free(LockedPool *this,void *__ptr)

{
  long lVar1;
  bool bVar2;
  reference this_00;
  runtime_error *this_01;
  long in_FS_OFFSET;
  LockedPageArena *arena;
  list<LockedPool::LockedPageArena,_std::allocator<LockedPool::LockedPageArena>_> *__range1;
  iterator __end1;
  iterator __begin1;
  lock_guard<std::mutex> lock;
  lock_guard<std::mutex> *in_stack_ffffffffffffff88;
  list<LockedPool::LockedPageArena,_std::allocator<LockedPool::LockedPageArena>_>
  *in_stack_ffffffffffffff90;
  _Self *in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::lock_guard<std::mutex>::lock_guard(in_stack_ffffffffffffff88,(mutex_type *)0xfffe38);
  std::__cxx11::list<LockedPool::LockedPageArena,_std::allocator<LockedPool::LockedPageArena>_>::
  begin(in_stack_ffffffffffffff90);
  std::__cxx11::list<LockedPool::LockedPageArena,_std::allocator<LockedPool::LockedPageArena>_>::end
            (in_stack_ffffffffffffff90);
  do {
    bVar2 = std::operator==(in_stack_ffffffffffffff98,(_Self *)in_stack_ffffffffffffff90);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this_01,"LockedPool: invalid address not pointing to any arena");
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
LAB_00ffffa5:
      __stack_chk_fail();
    }
    this_00 = std::_List_iterator<LockedPool::LockedPageArena>::operator*
                        ((_List_iterator<LockedPool::LockedPageArena> *)in_stack_ffffffffffffff88);
    in_stack_ffffffffffffffa7 =
         Arena::addressInArena
                   ((Arena *)this,
                    (void *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
    if ((bool)in_stack_ffffffffffffffa7) {
      Arena::free(&this_00->super_Arena,__ptr);
      std::lock_guard<std::mutex>::~lock_guard(in_stack_ffffffffffffff88);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return;
      }
      goto LAB_00ffffa5;
    }
    std::_List_iterator<LockedPool::LockedPageArena>::operator++
              ((_List_iterator<LockedPool::LockedPageArena> *)in_stack_ffffffffffffff88);
  } while( true );
}

Assistant:

void LockedPool::free(void *ptr)
{
    std::lock_guard<std::mutex> lock(mutex);
    // TODO we can do better than this linear search by keeping a map of arena
    // extents to arena, and looking up the address.
    for (auto &arena: arenas) {
        if (arena.addressInArena(ptr)) {
            arena.free(ptr);
            return;
        }
    }
    throw std::runtime_error("LockedPool: invalid address not pointing to any arena");
}